

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Pooling_x86_avx::forward(Pooling_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  size_t _elemsize;
  _func_int **pp_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  uint uVar14;
  int i;
  int iVar15;
  uint uVar16;
  _func_int *p_Var17;
  void *pvVar18;
  ulong uVar19;
  void *pvVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  int iVar29;
  Pooling *this_00;
  int k;
  long lVar30;
  ulong uVar31;
  int iVar32;
  long lVar33;
  int ki;
  long lVar34;
  ulong uVar35;
  void *pvVar36;
  undefined1 (*pauVar37) [32];
  undefined1 (*pauVar38) [16];
  int iVar39;
  float *pfVar40;
  uint uVar41;
  long lVar42;
  ulong uVar43;
  undefined4 *puVar44;
  bool bVar45;
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  int local_1a0;
  void *local_190;
  Mat m;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  Mat bottom_blob_bordered;
  Mat bottom_blob_bordered_1;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  this_00 = (Pooling *)((long)&this->_vptr_Pooling_x86_avx + (long)this->_vptr_Pooling_x86_avx[-3]);
  if (*(int *)(&this->field_0x100 + (long)this->_vptr_Pooling_x86_avx[-3]) != 0) {
LAB_001d8326:
    iVar15 = Pooling::forward(this_00,bottom_blob,top_blob,opt);
    return iVar15;
  }
  iVar15 = bottom_blob->w;
  iVar23 = bottom_blob->h;
  uVar16 = bottom_blob->c;
  uVar19 = (ulong)uVar16;
  _elemsize = bottom_blob->elemsize;
  if (bottom_blob->elempack != 4) {
    if (bottom_blob->elempack != 8) {
      if ((((this_00->kernel_w == this_00->kernel_h) && (this_00->stride_w == this_00->stride_h)) &&
          (this_00->stride_w == 2)) &&
         (((this_00->pooling_type == 0 && (this_00->global_pooling != 1)) &&
          (this_00->kernel_w == 2)))) {
        bottom_blob_bordered.cstep = 0;
        bottom_blob_bordered.data = (void *)0x0;
        bottom_blob_bordered.refcount._0_4_ = 0;
        bottom_blob_bordered.refcount._4_4_ = 0;
        bottom_blob_bordered.elemsize._0_4_ = 0;
        bottom_blob_bordered._20_8_ = 0;
        bottom_blob_bordered.allocator = (Allocator *)0x0;
        bottom_blob_bordered.dims = 0;
        bottom_blob_bordered.w = 0;
        bottom_blob_bordered.h = 0;
        bottom_blob_bordered.d = 0;
        bottom_blob_bordered.c = 0;
        Pooling::make_padding(this_00,bottom_blob,&bottom_blob_bordered,opt);
        iVar15 = -100;
        if ((bottom_blob_bordered.data != (void *)0x0) &&
           ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep != 0)) {
          p_Var17 = this->_vptr_Pooling_x86_avx[-3];
          Mat::create(top_blob,(bottom_blob_bordered.w - *(int *)(&this->field_0xd4 + (long)p_Var17)
                               ) / *(int *)(&this->field_0xdc + (long)p_Var17) + 1,
                      (bottom_blob_bordered.h - *(int *)(&this->field_0xd8 + (long)p_Var17)) /
                      *(int *)(&this->field_0xe0 + (long)p_Var17) + 1,uVar16,_elemsize,
                      opt->blob_allocator);
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
            lVar30 = (long)bottom_blob_bordered.w;
            iVar23 = top_blob->w;
            iVar22 = top_blob->h;
            if (top_blob->h < 1) {
              iVar22 = 0;
            }
            iVar39 = bottom_blob_bordered.c;
            if (bottom_blob_bordered.c < 1) {
              iVar39 = 0;
            }
            lVar33 = (long)((bottom_blob_bordered.w - iVar23) * 2) * 4;
            iVar27 = 0;
            while( true ) {
              iVar15 = 0;
              if (iVar27 == iVar39) break;
              Mat::channel(&m,&bottom_blob_bordered,iVar27);
              pvVar18 = m.data;
              Mat::~Mat(&m);
              Mat::channel(&m,top_blob,iVar27);
              puVar44 = (undefined4 *)m.data;
              Mat::~Mat(&m);
              pvVar36 = (void *)((long)pvVar18 + lVar30 * 4);
              for (iVar15 = 0; iVar15 != iVar22; iVar15 = iVar15 + 1) {
                lVar28 = 0;
                for (iVar25 = iVar23; 0 < iVar25; iVar25 = iVar25 + -1) {
                  auVar13 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar18 + lVar28 + 4)),
                                       ZEXT416(*(uint *)((long)pvVar18 + lVar28)));
                  auVar48 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar36 + lVar28 + 4)),
                                       ZEXT416(*(uint *)((long)pvVar36 + lVar28)));
                  auVar13 = vmaxss_avx(auVar48,auVar13);
                  *puVar44 = auVar13._0_4_;
                  puVar44 = puVar44 + 1;
                  lVar28 = lVar28 + 8;
                }
                pvVar18 = (void *)((long)pvVar18 + lVar28 + lVar33);
                pvVar36 = (void *)((long)pvVar36 + lVar28 + lVar33);
              }
              iVar27 = iVar27 + 1;
            }
          }
        }
        Mat::~Mat(&bottom_blob_bordered);
        return iVar15;
      }
      goto LAB_001d8326;
    }
    if (this_00->global_pooling != 0) {
      Mat::create(top_blob,uVar16,_elemsize,8,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      iVar23 = iVar23 * iVar15;
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Pooling_x86_avx[-3]) == 1) {
        auVar13 = vshufps_avx(ZEXT416((uint)(1.0 / (float)iVar23)),
                              ZEXT416((uint)(1.0 / (float)iVar23)),0);
        if (iVar23 < 1) {
          iVar23 = 0;
        }
        if ((int)uVar16 < 1) {
          uVar19 = 0;
        }
        for (uVar43 = 0; uVar43 != uVar19; uVar43 = uVar43 + 1) {
          Mat::channel(&m,bottom_blob,(int)uVar43);
          pfVar40 = (float *)m.data;
          Mat::~Mat(&m);
          fVar53 = 0.0;
          fVar54 = 0.0;
          fVar46 = 0.0;
          fVar52 = 0.0;
          fVar55 = 0.0;
          fVar56 = 0.0;
          fVar57 = 0.0;
          fVar58 = 0.0;
          iVar15 = iVar23;
          while (bVar45 = iVar15 != 0, iVar15 = iVar15 + -1, bVar45) {
            fVar46 = fVar46 + *pfVar40;
            fVar52 = fVar52 + pfVar40[1];
            fVar53 = fVar53 + pfVar40[2];
            fVar54 = fVar54 + pfVar40[3];
            fVar55 = fVar55 + pfVar40[4];
            fVar56 = fVar56 + pfVar40[5];
            fVar57 = fVar57 + pfVar40[6];
            fVar58 = fVar58 + pfVar40[7];
            pfVar40 = pfVar40 + 8;
          }
          local_128 = auVar13._0_4_;
          fStack_124 = auVar13._4_4_;
          fStack_120 = auVar13._8_4_;
          fStack_11c = auVar13._12_4_;
          pfVar40 = (float *)((long)top_blob->data + uVar43 * 0x20);
          *pfVar40 = fVar46 * local_128;
          pfVar40[1] = fVar52 * fStack_124;
          pfVar40[2] = fVar53 * fStack_120;
          pfVar40[3] = fVar54 * fStack_11c;
          pfVar40[4] = fVar55 * local_128;
          pfVar40[5] = fVar56 * fStack_124;
          pfVar40[6] = fVar57 * fStack_120;
          pfVar40[7] = fVar58;
        }
        return 0;
      }
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Pooling_x86_avx[-3]) != 0) {
        return 0;
      }
      if (iVar23 < 1) {
        iVar23 = 0;
      }
      if ((int)uVar16 < 1) {
        uVar19 = 0;
      }
      for (uVar43 = 0; uVar43 != uVar19; uVar43 = uVar43 + 1) {
        Mat::channel(&m,bottom_blob,(int)uVar43);
        pauVar37 = (undefined1 (*) [32])m.data;
        Mat::~Mat(&m);
        auVar1 = *pauVar37;
        iVar15 = iVar23;
        while (bVar45 = iVar15 != 0, iVar15 = iVar15 + -1, bVar45) {
          auVar1 = vmaxps_avx(auVar1,*pauVar37);
          pauVar37 = pauVar37 + 1;
        }
        *(undefined1 (*) [32])((long)top_blob->data + uVar43 * 0x20) = auVar1;
      }
      return 0;
    }
    bottom_blob_bordered_1.cstep = 0;
    bottom_blob_bordered_1.data = (void *)0x0;
    bottom_blob_bordered_1.refcount._0_4_ = 0;
    bottom_blob_bordered_1.refcount._4_4_ = 0;
    bottom_blob_bordered_1._16_12_ = SUB1612(ZEXT816(0),4);
    bottom_blob_bordered_1._32_12_ = SUB1612(ZEXT816(0),0);
    bottom_blob_bordered_1.h = 0;
    bottom_blob_bordered_1.d = 0;
    bottom_blob_bordered_1.c = 0;
    bottom_blob_bordered_1.w = bottom_blob_bordered_1.refcount._4_4_;
    Pooling::make_padding(this_00,bottom_blob,&bottom_blob_bordered_1,opt);
    iVar22 = bottom_blob_bordered_1.h;
    iVar23 = bottom_blob_bordered_1.w;
    iVar15 = -100;
    if ((bottom_blob_bordered_1.data == (void *)0x0) ||
       ((long)bottom_blob_bordered_1.c * bottom_blob_bordered_1.cstep == 0)) goto LAB_001d9e25;
    p_Var17 = this->_vptr_Pooling_x86_avx[-3];
    iVar39 = (bottom_blob_bordered_1.w - *(int *)(&this->field_0xd4 + (long)p_Var17)) /
             *(int *)(&this->field_0xdc + (long)p_Var17);
    iVar27 = (bottom_blob_bordered_1.h - *(int *)(&this->field_0xd8 + (long)p_Var17)) /
             *(int *)(&this->field_0xe0 + (long)p_Var17);
    iVar25 = iVar39 + 1;
    Mat::create(top_blob,iVar25,iVar27 + 1,uVar16,_elemsize,8,opt->blob_allocator);
    if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
    goto LAB_001d9e25;
    uVar43 = (long)*(int *)(&this->field_0xd8 + (long)this->_vptr_Pooling_x86_avx[-3]) *
             (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_Pooling_x86_avx[-3]);
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,uVar43,(allocator_type *)&m);
    pp_Var3 = this->_vptr_Pooling_x86_avx;
    p_Var17 = pp_Var3[-3];
    iVar15 = *(int *)(&this->field_0xd4 + (long)p_Var17);
    iVar29 = 0;
    lVar30 = 0;
    for (iVar26 = 0; iVar32 = *(int *)(&this->field_0xd8 + (long)p_Var17), iVar26 < iVar32;
        iVar26 = iVar26 + 1) {
      for (lVar33 = 0; iVar32 = (int)lVar33, iVar32 < *(int *)(&this->field_0xd4 + (long)p_Var17);
          lVar33 = lVar33 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar30 + lVar33] = iVar29 + iVar32;
        p_Var17 = pp_Var3[-3];
      }
      iVar29 = iVar29 + (iVar23 - iVar15) + iVar32;
      lVar30 = (int)lVar30 + lVar33;
    }
    lVar30 = (long)iVar39;
    iVar15 = (int)uVar43;
    if (*(int *)(&this->field_0xd0 + (long)p_Var17) == 0) {
      if (iVar32 == 2 && *(int *)(&this->field_0xd4 + (long)p_Var17) == 2) {
        if ((*(int *)(&this->field_0xdc + (long)p_Var17) == 2) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var17) == 2)) {
          iVar15 = top_blob->w;
          iVar23 = bottom_blob_bordered_1.w - iVar15;
          iVar22 = 0;
          if (iVar15 < 1) {
            iVar15 = iVar22;
          }
          iVar39 = top_blob->h;
          if (top_blob->h < 1) {
            iVar39 = iVar22;
          }
          iVar27 = bottom_blob_bordered_1.c;
          if (bottom_blob_bordered_1.c < 1) {
            iVar27 = iVar22;
          }
          for (; iVar22 != iVar27; iVar22 = iVar22 + 1) {
            Mat::channel(&m,&bottom_blob_bordered_1,iVar22);
            Mat::channel(&bottom_blob_bordered,top_blob,iVar22);
            pvVar36 = bottom_blob_bordered.data;
            Mat::~Mat(&bottom_blob_bordered);
            pvVar20 = (void *)((long)m.w * m.elemsize + (long)m.data);
            pvVar18 = m.data;
            for (iVar25 = 0; iVar25 != iVar39; iVar25 = iVar25 + 1) {
              lVar33 = 0;
              lVar30 = (long)(iVar23 * 0x10) * -4;
              iVar26 = iVar15;
              while (bVar45 = iVar26 != 0, iVar26 = iVar26 + -1, bVar45) {
                auVar1 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar18 + lVar33 * 2),
                                    *(undefined1 (*) [32])((long)pvVar18 + lVar33 * 2 + 0x20));
                auVar7 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar20 + lVar33 * 2),
                                    *(undefined1 (*) [32])((long)pvVar20 + lVar33 * 2 + 0x20));
                auVar1 = vmaxps_avx(auVar1,auVar7);
                *(undefined1 (*) [32])((long)pvVar36 + lVar33) = auVar1;
                lVar30 = lVar30 + -0x40;
                lVar33 = lVar33 + 0x20;
              }
              pvVar18 = (void *)((long)pvVar18 - lVar30);
              pvVar20 = (void *)((long)pvVar20 - lVar30);
              pvVar36 = (void *)((long)pvVar36 + lVar33);
            }
            Mat::~Mat(&m);
          }
        }
        else {
LAB_001d94f4:
          uVar31 = 0;
          uVar43 = uVar43 & 0xffffffff;
          if (iVar15 < 1) {
            uVar43 = uVar31;
          }
          if ((int)uVar16 < 1) {
            uVar19 = uVar31;
          }
          while( true ) {
            local_1a0 = (int)uVar19;
            iVar15 = (int)uVar31;
            if (iVar15 == local_1a0) break;
            Mat::channel(&m,&bottom_blob_bordered_1,iVar15);
            Mat::channel(&bottom_blob_bordered,top_blob,iVar15);
            pvVar36 = bottom_blob_bordered.data;
            Mat::~Mat(&bottom_blob_bordered);
            for (iVar23 = 0; iVar23 <= iVar27; iVar23 = iVar23 + 1) {
              pp_Var3 = this->_vptr_Pooling_x86_avx;
              for (lVar33 = 0; lVar33 <= lVar30; lVar33 = lVar33 + 1) {
                pauVar37 = (undefined1 (*) [32])
                           ((long)m.data +
                           (long)(*(int *)(&this->field_0xdc + (long)pp_Var3[-3]) * (int)lVar33 * 8)
                           * 4 + (long)m.w * (long)iVar23 *
                                 (long)*(int *)(&this->field_0xe0 + (long)pp_Var3[-3]) * m.elemsize)
                ;
                auVar1 = *pauVar37;
                for (uVar31 = 0; uVar43 != uVar31; uVar31 = uVar31 + 1) {
                  auVar1 = vmaxps_avx(auVar1,pauVar37[_space_ofs.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start
                                                      [uVar31]]);
                }
                *(undefined1 (*) [32])((long)pvVar36 + lVar33 * 0x20) = auVar1;
              }
              pvVar36 = (void *)((long)pvVar36 + (long)(iVar25 * 8) * 4);
            }
            Mat::~Mat(&m);
            uVar31 = (ulong)(iVar15 + 1);
          }
        }
      }
      else {
        if (((iVar32 != 3 || *(int *)(&this->field_0xd4 + (long)p_Var17) != 3) ||
            (*(int *)(&this->field_0xdc + (long)p_Var17) != 2)) ||
           (*(int *)(&this->field_0xe0 + (long)p_Var17) != 2)) goto LAB_001d94f4;
        iVar15 = top_blob->w;
        iVar23 = top_blob->h;
        iVar22 = 0;
        if (iVar23 < 1) {
          iVar23 = 0;
        }
        iVar39 = bottom_blob_bordered_1.c;
        if (bottom_blob_bordered_1.c < 1) {
          iVar39 = 0;
        }
        lVar30 = (long)((bottom_blob_bordered_1.w - iVar15) * 0x10) * 4;
        for (; iVar22 != iVar39; iVar22 = iVar22 + 1) {
          Mat::channel(&m,&bottom_blob_bordered_1,iVar22);
          Mat::channel(&bottom_blob_bordered,top_blob,iVar22);
          pauVar37 = (undefined1 (*) [32])bottom_blob_bordered.data;
          Mat::~Mat(&bottom_blob_bordered);
          pvVar36 = (void *)((long)m.data + (long)m.w * m.elemsize);
          pvVar18 = (void *)((long)m.data + (long)m.w * m.elemsize * 2);
          pvVar20 = m.data;
          for (iVar27 = 0; iVar27 != iVar23; iVar27 = iVar27 + 1) {
            lVar33 = 0;
            for (iVar25 = 0; iVar25 + 3 < iVar15; iVar25 = iVar25 + 4) {
              auVar1 = *(undefined1 (*) [32])((long)pvVar20 + lVar33 + 0x40);
              auVar7 = *(undefined1 (*) [32])((long)pvVar20 + lVar33 + 0x80);
              auVar8 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar20 + lVar33),
                                  *(undefined1 (*) [32])((long)pvVar20 + lVar33 + 0x20));
              auVar8 = vmaxps_avx(auVar8,auVar1);
              auVar8 = vmaxps_avx(auVar8,*(undefined1 (*) [32])((long)pvVar36 + lVar33));
              auVar9 = vmaxps_avx(auVar8,*(undefined1 (*) [32])((long)pvVar36 + lVar33 + 0x20));
              auVar8 = *(undefined1 (*) [32])((long)pvVar36 + lVar33 + 0x40);
              auVar2 = *(undefined1 (*) [32])((long)pvVar36 + lVar33 + 0x80);
              auVar10 = vmaxps_avx(auVar8,*(undefined1 (*) [32])((long)pvVar18 + lVar33));
              auVar11 = vmaxps_avx(auVar10,*(undefined1 (*) [32])((long)pvVar18 + lVar33 + 0x20));
              auVar12 = vmaxps_avx(auVar7,*(undefined1 (*) [32])((long)pvVar20 + lVar33 + 0x60));
              auVar10 = *(undefined1 (*) [32])((long)pvVar18 + lVar33 + 0x40);
              auVar12 = vmaxps_avx(auVar12,auVar1);
              auVar1 = *(undefined1 (*) [32])((long)pvVar18 + lVar33 + 0x80);
              auVar11 = vmaxps_avx(auVar11,auVar10);
              auVar12 = vmaxps_avx(auVar12,*(undefined1 (*) [32])((long)pvVar36 + lVar33 + 0x60));
              auVar8 = vmaxps_avx(auVar8,*(undefined1 (*) [32])((long)pvVar18 + lVar33 + 0x60));
              auVar9 = vmaxps_avx(auVar9,auVar11);
              *pauVar37 = auVar9;
              auVar9 = vmaxps_avx(auVar2,auVar1);
              auVar10 = vmaxps_avx(auVar9,auVar10);
              auVar8 = vmaxps_avx(auVar10,auVar8);
              auVar11 = vmaxps_avx(auVar12,auVar8);
              auVar8 = *(undefined1 (*) [32])((long)pvVar20 + lVar33 + 0xc0);
              auVar10 = *(undefined1 (*) [32])((long)pvVar36 + lVar33 + 0xc0);
              auVar9 = *(undefined1 (*) [32])((long)pvVar18 + lVar33 + 0xc0);
              auVar12 = vmaxps_avx(auVar8,*(undefined1 (*) [32])((long)pvVar20 + lVar33 + 0xa0));
              auVar7 = vmaxps_avx(auVar12,auVar7);
              auVar7 = vmaxps_avx(auVar7,*(undefined1 (*) [32])((long)pvVar36 + lVar33 + 0xa0));
              auVar2 = vmaxps_avx(auVar2,*(undefined1 (*) [32])((long)pvVar18 + lVar33 + 0xa0));
              pauVar37[1] = auVar11;
              auVar11 = vmaxps_avx(auVar10,auVar9);
              auVar1 = vmaxps_avx(auVar11,auVar1);
              auVar1 = vmaxps_avx(auVar1,auVar2);
              auVar2 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar20 + lVar33 + 0xe0),
                                  *(undefined1 (*) [32])((long)pvVar20 + lVar33 + 0x100));
              auVar8 = vmaxps_avx(auVar2,auVar8);
              auVar8 = vmaxps_avx(auVar8,*(undefined1 (*) [32])((long)pvVar36 + lVar33 + 0xe0));
              auVar8 = vmaxps_avx(auVar8,*(undefined1 (*) [32])((long)pvVar36 + lVar33 + 0x100));
              auVar2 = vmaxps_avx(auVar10,*(undefined1 (*) [32])((long)pvVar18 + lVar33 + 0xe0));
              auVar8 = vmaxps_avx(auVar8,*(undefined1 (*) [32])((long)pvVar18 + lVar33 + 0x100));
              auVar1 = vmaxps_avx(auVar7,auVar1);
              pauVar37[2] = auVar1;
              auVar1 = vmaxps_avx(auVar9,auVar2);
              auVar1 = vmaxps_avx(auVar8,auVar1);
              pauVar37[3] = auVar1;
              pauVar37 = pauVar37 + 4;
              lVar33 = lVar33 + 0x100;
            }
            for (; iVar25 + 1 < iVar15; iVar25 = iVar25 + 2) {
              auVar1 = *(undefined1 (*) [32])((long)pvVar36 + lVar33 + 0x40);
              auVar7 = *(undefined1 (*) [32])((long)pvVar18 + lVar33 + 0x40);
              auVar8 = *(undefined1 (*) [32])((long)pvVar20 + lVar33 + 0x40);
              auVar2 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar20 + lVar33),
                                  *(undefined1 (*) [32])((long)pvVar20 + lVar33 + 0x20));
              auVar2 = vmaxps_avx(auVar2,auVar8);
              auVar2 = vmaxps_avx(auVar2,*(undefined1 (*) [32])((long)pvVar36 + lVar33));
              auVar2 = vmaxps_avx(auVar2,*(undefined1 (*) [32])((long)pvVar36 + lVar33 + 0x20));
              auVar10 = vmaxps_avx(auVar1,*(undefined1 (*) [32])((long)pvVar18 + lVar33));
              auVar10 = vmaxps_avx(auVar10,*(undefined1 (*) [32])((long)pvVar18 + lVar33 + 0x20));
              auVar10 = vmaxps_avx(auVar10,auVar7);
              auVar9 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar20 + lVar33 + 0x60),
                                  *(undefined1 (*) [32])((long)pvVar20 + lVar33 + 0x80));
              auVar8 = vmaxps_avx(auVar9,auVar8);
              auVar8 = vmaxps_avx(auVar8,*(undefined1 (*) [32])((long)pvVar36 + lVar33 + 0x60));
              auVar8 = vmaxps_avx(auVar8,*(undefined1 (*) [32])((long)pvVar36 + lVar33 + 0x80));
              auVar1 = vmaxps_avx(auVar1,*(undefined1 (*) [32])((long)pvVar18 + lVar33 + 0x60));
              auVar8 = vmaxps_avx(auVar8,*(undefined1 (*) [32])((long)pvVar18 + lVar33 + 0x80));
              auVar2 = vmaxps_avx(auVar2,auVar10);
              *pauVar37 = auVar2;
              auVar1 = vmaxps_avx(auVar7,auVar1);
              auVar1 = vmaxps_avx(auVar8,auVar1);
              pauVar37[1] = auVar1;
              pauVar37 = pauVar37 + 2;
              lVar33 = lVar33 + 0x80;
            }
            for (; iVar25 < iVar15; iVar25 = iVar25 + 1) {
              auVar1 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar20 + lVar33),
                                  *(undefined1 (*) [32])((long)pvVar20 + lVar33 + 0x20));
              auVar1 = vmaxps_avx(auVar1,*(undefined1 (*) [32])((long)pvVar20 + lVar33 + 0x40));
              auVar1 = vmaxps_avx(auVar1,*(undefined1 (*) [32])((long)pvVar36 + lVar33));
              auVar1 = vmaxps_avx(auVar1,*(undefined1 (*) [32])((long)pvVar36 + lVar33 + 0x20));
              auVar7 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar36 + lVar33 + 0x40),
                                  *(undefined1 (*) [32])((long)pvVar18 + lVar33));
              auVar7 = vmaxps_avx(auVar7,*(undefined1 (*) [32])((long)pvVar18 + lVar33 + 0x20));
              auVar7 = vmaxps_avx(auVar7,*(undefined1 (*) [32])((long)pvVar18 + lVar33 + 0x40));
              auVar1 = vmaxps_avx(auVar1,auVar7);
              *pauVar37 = auVar1;
              pauVar37 = pauVar37 + 1;
              lVar33 = lVar33 + 0x40;
            }
            pvVar20 = (void *)((long)pvVar20 + lVar33 + lVar30);
            pvVar36 = (void *)((long)pvVar36 + lVar33 + lVar30);
            pvVar18 = (void *)((long)pvVar18 + lVar33 + lVar30);
          }
          Mat::~Mat(&m);
        }
      }
    }
    else if (*(int *)(&this->field_0xd0 + (long)p_Var17) == 1) {
      if (*(int *)(&this->field_0xfc + (long)p_Var17) == 0) {
        iVar15 = 0;
        iVar39 = 0;
        if (*(int *)(&this->field_0xf8 + (long)p_Var17) == 0) {
          iVar39 = (bottom_blob->w - bottom_blob_bordered_1.w) +
                   *(int *)(&this->field_0xe4 + (long)p_Var17) +
                   *(int *)(&this->field_0xe8 + (long)p_Var17);
          iVar15 = (bottom_blob->h - bottom_blob_bordered_1.h) +
                   *(int *)(&this->field_0xec + (long)p_Var17) +
                   *(int *)(&this->field_0xf0 + (long)p_Var17);
        }
        if ((int)uVar16 < 1) {
          uVar16 = 0;
        }
        for (uVar41 = 0; uVar41 != uVar16; uVar41 = uVar41 + 1) {
          Mat::channel(&m,&bottom_blob_bordered_1,uVar41);
          Mat::channel(&bottom_blob_bordered,top_blob,uVar41);
          local_190 = bottom_blob_bordered.data;
          Mat::~Mat(&bottom_blob_bordered);
          pp_Var3 = this->_vptr_Pooling_x86_avx;
          for (iVar26 = 0; iVar26 <= iVar27; iVar26 = iVar26 + 1) {
            lVar33 = (long)(*(int *)(&this->field_0xe0 + (long)pp_Var3[-3]) * iVar26);
            for (lVar28 = 0; lVar28 <= lVar30; lVar28 = lVar28 + 1) {
              p_Var17 = pp_Var3[-3];
              uVar43 = 0;
              uVar19 = (ulong)*(uint *)(&this->field_0xd8 + (long)p_Var17);
              if ((int)*(uint *)(&this->field_0xd8 + (long)p_Var17) < 1) {
                uVar19 = uVar43;
              }
              lVar24 = (long)(*(int *)(&this->field_0xdc + (long)p_Var17) * (int)lVar28);
              lVar34 = lVar24 * 0x20 + (long)m.w * m.elemsize * lVar33 + (long)m.data;
              auVar49 = ZEXT1664(ZEXT816(0) << 0x40);
              iVar29 = 0;
              for (; uVar43 != uVar19; uVar43 = uVar43 + 1) {
                lVar21 = uVar43 + lVar33;
                if (*(int *)(&this->field_0xec + (long)p_Var17) <= lVar21) {
                  if ((iVar15 + iVar22) - *(int *)(&this->field_0xf0 + (long)p_Var17) <= lVar21)
                  break;
                  uVar14 = *(uint *)(&this->field_0xd4 + (long)p_Var17);
                  if ((int)*(uint *)(&this->field_0xd4 + (long)p_Var17) < 1) {
                    uVar14 = 0;
                  }
                  lVar21 = lVar24;
                  for (lVar42 = 0; (ulong)uVar14 * 0x20 != lVar42; lVar42 = lVar42 + 0x20) {
                    if (*(int *)(&this->field_0xe4 + (long)p_Var17) <= lVar21) {
                      if ((iVar39 + iVar23) - *(int *)(&this->field_0xe8 + (long)p_Var17) <= lVar21)
                      break;
                      pfVar40 = (float *)(lVar34 + lVar42);
                      auVar49 = ZEXT3264(CONCAT428(auVar49._28_4_ + pfVar40[7],
                                                   CONCAT424(auVar49._24_4_ + pfVar40[6],
                                                             CONCAT420(auVar49._20_4_ + pfVar40[5],
                                                                       CONCAT416(auVar49._16_4_ +
                                                                                 pfVar40[4],
                                                                                 CONCAT412(auVar49.
                                                  _12_4_ + pfVar40[3],
                                                  CONCAT48(auVar49._8_4_ + pfVar40[2],
                                                           CONCAT44(auVar49._4_4_ + pfVar40[1],
                                                                    auVar49._0_4_ + *pfVar40))))))))
                      ;
                      iVar29 = iVar29 + 1;
                    }
                    lVar21 = lVar21 + 1;
                  }
                }
                lVar34 = lVar34 + (long)m.w * m.elemsize;
              }
              auVar13 = vshufps_avx(ZEXT416((uint)(1.0 / (float)iVar29)),
                                    ZEXT416((uint)(1.0 / (float)iVar29)),0);
              auVar51._0_4_ = auVar13._0_4_ * auVar49._0_4_;
              auVar51._4_4_ = auVar13._4_4_ * auVar49._4_4_;
              auVar51._8_4_ = auVar13._8_4_ * auVar49._8_4_;
              auVar51._12_4_ = auVar13._12_4_ * auVar49._12_4_;
              auVar51._16_4_ = auVar13._0_4_ * auVar49._16_4_;
              auVar51._20_4_ = auVar13._4_4_ * auVar49._20_4_;
              auVar51._28_36_ = auVar49._28_36_;
              auVar51._24_4_ = auVar13._8_4_ * auVar49._24_4_;
              *(undefined1 (*) [32])((long)local_190 + lVar28 * 0x20) = auVar51._0_32_;
            }
            local_190 = (void *)((long)local_190 + (long)(iVar25 * 8) * 4);
          }
          Mat::~Mat(&m);
        }
      }
      else {
        auVar13 = vshufps_avx(ZEXT416((uint)(1.0 / (float)iVar15)),
                              ZEXT416((uint)(1.0 / (float)iVar15)),0);
        uVar31 = 0;
        uVar43 = uVar43 & 0xffffffff;
        if (iVar15 < 1) {
          uVar43 = uVar31;
        }
        if ((int)uVar16 < 1) {
          uVar19 = uVar31;
        }
        while( true ) {
          local_1a0 = (int)uVar19;
          iVar15 = (int)uVar31;
          if (iVar15 == local_1a0) break;
          Mat::channel(&m,&bottom_blob_bordered_1,iVar15);
          Mat::channel(&bottom_blob_bordered,top_blob,iVar15);
          pvVar36 = bottom_blob_bordered.data;
          Mat::~Mat(&bottom_blob_bordered);
          for (iVar23 = 0; iVar23 <= iVar27; iVar23 = iVar23 + 1) {
            pp_Var3 = this->_vptr_Pooling_x86_avx;
            for (lVar33 = 0; lVar33 <= lVar30; lVar33 = lVar33 + 1) {
              auVar49 = ZEXT1664(ZEXT816(0) << 0x40);
              uVar31 = 0;
              while( true ) {
                auVar50._28_36_ = auVar49._28_36_;
                if (uVar43 == uVar31) break;
                pfVar40 = (float *)((long)m.data +
                                   (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start[uVar31] * 0x20 +
                                   (long)(*(int *)(&this->field_0xdc + (long)pp_Var3[-3]) *
                                          (int)lVar33 * 8) * 4 +
                                   (long)m.w * (long)iVar23 *
                                   (long)*(int *)(&this->field_0xe0 + (long)pp_Var3[-3]) *
                                   m.elemsize);
                auVar49 = ZEXT3264(CONCAT428(auVar49._28_4_ + pfVar40[7],
                                             CONCAT424(auVar49._24_4_ + pfVar40[6],
                                                       CONCAT420(auVar49._20_4_ + pfVar40[5],
                                                                 CONCAT416(auVar49._16_4_ +
                                                                           pfVar40[4],
                                                                           CONCAT412(auVar49._12_4_
                                                                                     + pfVar40[3],
                                                                                     CONCAT48(
                                                  auVar49._8_4_ + pfVar40[2],
                                                  CONCAT44(auVar49._4_4_ + pfVar40[1],
                                                           auVar49._0_4_ + *pfVar40))))))));
                uVar31 = uVar31 + 1;
              }
              local_108 = auVar13._0_4_;
              fStack_104 = auVar13._4_4_;
              fStack_100 = auVar13._8_4_;
              fStack_fc = auVar13._12_4_;
              auVar50._0_4_ = auVar49._0_4_ * local_108;
              auVar50._4_4_ = auVar49._4_4_ * fStack_104;
              auVar50._8_4_ = auVar49._8_4_ * fStack_100;
              auVar50._12_4_ = auVar49._12_4_ * fStack_fc;
              auVar50._16_4_ = auVar49._16_4_ * local_108;
              auVar50._20_4_ = auVar49._20_4_ * fStack_104;
              auVar50._24_4_ = auVar49._24_4_ * fStack_100;
              *(undefined1 (*) [32])((long)pvVar36 + lVar33 * 0x20) = auVar50._0_32_;
            }
            pvVar36 = (void *)((long)pvVar36 + (long)(iVar25 * 8) * 4);
          }
          Mat::~Mat(&m);
          uVar31 = (ulong)(iVar15 + 1);
        }
      }
    }
    goto LAB_001d9e12;
  }
  if (this_00->global_pooling != 0) {
    Mat::create(top_blob,uVar16,_elemsize,4,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep != 0) {
      uVar41 = iVar23 * iVar15;
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Pooling_x86_avx[-3]) == 1) {
        auVar13 = vshufps_avx(ZEXT416((uint)(1.0 / (float)(int)uVar41)),
                              ZEXT416((uint)(1.0 / (float)(int)uVar41)),0);
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        if ((int)uVar16 < 1) {
          uVar19 = 0;
        }
        for (uVar43 = 0; uVar43 != uVar19; uVar43 = uVar43 + 1) {
          Mat::channel(&m,bottom_blob,(int)uVar43);
          pfVar40 = (float *)m.data;
          Mat::~Mat(&m);
          fVar53 = 0.0;
          fVar54 = 0.0;
          fVar46 = 0.0;
          fVar52 = 0.0;
          uVar16 = uVar41;
          while (bVar45 = uVar16 != 0, uVar16 = uVar16 - 1, bVar45) {
            fVar53 = fVar53 + *pfVar40;
            fVar54 = fVar54 + pfVar40[1];
            fVar46 = fVar46 + pfVar40[2];
            fVar52 = fVar52 + pfVar40[3];
            pfVar40 = pfVar40 + 4;
          }
          local_128 = auVar13._0_4_;
          fStack_124 = auVar13._4_4_;
          fStack_120 = auVar13._8_4_;
          fStack_11c = auVar13._12_4_;
          pfVar40 = (float *)((long)top_blob->data + uVar43 * 0x10);
          *pfVar40 = fVar53 * local_128;
          pfVar40[1] = fVar54 * fStack_124;
          pfVar40[2] = fVar46 * fStack_120;
          pfVar40[3] = fVar52 * fStack_11c;
        }
      }
      else if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Pooling_x86_avx[-3]) == 0) {
        uVar43 = (ulong)uVar41;
        if ((int)uVar41 < 1) {
          uVar43 = 0;
        }
        if ((int)uVar16 < 1) {
          uVar19 = 0;
        }
        for (uVar31 = 0; uVar31 != uVar19; uVar31 = uVar31 + 1) {
          Mat::channel(&m,bottom_blob,(int)uVar31);
          pauVar38 = (undefined1 (*) [16])m.data;
          Mat::~Mat(&m);
          auVar13 = *pauVar38;
          uVar35 = uVar43;
          while (iVar15 = (int)uVar35, uVar35 = (ulong)(iVar15 - 1), iVar15 != 0) {
            auVar13 = vmaxps_avx(auVar13,*pauVar38);
            pauVar38 = pauVar38 + 1;
          }
          *(undefined1 (*) [16])((long)top_blob->data + uVar31 * 0x10) = auVar13;
        }
      }
      return 0;
    }
    return -100;
  }
  bottom_blob_bordered_1.cstep = 0;
  bottom_blob_bordered_1.data = (void *)0x0;
  bottom_blob_bordered_1.refcount._0_4_ = 0;
  bottom_blob_bordered_1.refcount._4_4_ = 0;
  bottom_blob_bordered_1._16_12_ = SUB1612(ZEXT816(0),4);
  bottom_blob_bordered_1._32_12_ = SUB1612(ZEXT816(0),0);
  bottom_blob_bordered_1.h = 0;
  bottom_blob_bordered_1.d = 0;
  bottom_blob_bordered_1.c = 0;
  bottom_blob_bordered_1.w = bottom_blob_bordered_1.refcount._4_4_;
  Pooling::make_padding(this_00,bottom_blob,&bottom_blob_bordered_1,opt);
  iVar22 = bottom_blob_bordered_1.h;
  iVar23 = bottom_blob_bordered_1.w;
  iVar15 = -100;
  if ((bottom_blob_bordered_1.data == (void *)0x0) ||
     ((long)bottom_blob_bordered_1.c * bottom_blob_bordered_1.cstep == 0)) goto LAB_001d9e25;
  p_Var17 = this->_vptr_Pooling_x86_avx[-3];
  iVar39 = (bottom_blob_bordered_1.w - *(int *)(&this->field_0xd4 + (long)p_Var17)) /
           *(int *)(&this->field_0xdc + (long)p_Var17);
  iVar27 = (bottom_blob_bordered_1.h - *(int *)(&this->field_0xd8 + (long)p_Var17)) /
           *(int *)(&this->field_0xe0 + (long)p_Var17);
  iVar25 = iVar39 + 1;
  Mat::create(top_blob,iVar25,iVar27 + 1,uVar16,_elemsize,4,opt->blob_allocator);
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_001d9e25;
  uVar43 = (long)*(int *)(&this->field_0xd8 + (long)this->_vptr_Pooling_x86_avx[-3]) *
           (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_Pooling_x86_avx[-3]);
  std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,uVar43,(allocator_type *)&m);
  pp_Var3 = this->_vptr_Pooling_x86_avx;
  p_Var17 = pp_Var3[-3];
  iVar15 = *(int *)(&this->field_0xd4 + (long)p_Var17);
  lVar30 = 0;
  iVar26 = 0;
  for (iVar29 = 0; iVar32 = *(int *)(&this->field_0xd8 + (long)p_Var17), iVar29 < iVar32;
      iVar29 = iVar29 + 1) {
    for (lVar33 = 0; iVar32 = (int)lVar33, iVar32 < *(int *)(&this->field_0xd4 + (long)p_Var17);
        lVar33 = lVar33 + 1) {
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(int)lVar30 + lVar33] = iVar26 + iVar32;
      p_Var17 = pp_Var3[-3];
    }
    iVar26 = iVar26 + (iVar23 - iVar15) + iVar32;
    lVar30 = (int)lVar30 + lVar33;
  }
  lVar30 = (long)iVar39;
  iVar15 = (int)uVar43;
  if (*(int *)(&this->field_0xd0 + (long)p_Var17) == 0) {
    if (iVar32 == 2 && *(int *)(&this->field_0xd4 + (long)p_Var17) == 2) {
      if ((*(int *)(&this->field_0xdc + (long)p_Var17) == 2) &&
         (*(int *)(&this->field_0xe0 + (long)p_Var17) == 2)) {
        iVar15 = top_blob->w;
        iVar23 = bottom_blob_bordered_1.w - iVar15;
        iVar22 = 0;
        if (iVar15 < 1) {
          iVar15 = iVar22;
        }
        iVar39 = top_blob->h;
        if (top_blob->h < 1) {
          iVar39 = iVar22;
        }
        iVar27 = bottom_blob_bordered_1.c;
        if (bottom_blob_bordered_1.c < 1) {
          iVar27 = iVar22;
        }
        for (; iVar22 != iVar27; iVar22 = iVar22 + 1) {
          Mat::channel(&m,&bottom_blob_bordered_1,iVar22);
          Mat::channel(&bottom_blob_bordered,top_blob,iVar22);
          pvVar36 = bottom_blob_bordered.data;
          Mat::~Mat(&bottom_blob_bordered);
          pvVar20 = (void *)((long)m.w * m.elemsize + (long)m.data);
          pvVar18 = m.data;
          for (iVar25 = 0; iVar25 != iVar39; iVar25 = iVar25 + 1) {
            lVar33 = 0;
            lVar30 = (long)(iVar23 * 8) * -4;
            iVar26 = iVar15;
            while (bVar45 = iVar26 != 0, iVar26 = iVar26 + -1, bVar45) {
              auVar13 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar18 + lVar33 * 2),
                                   *(undefined1 (*) [16])((long)pvVar18 + lVar33 * 2 + 0x10));
              auVar48 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar20 + lVar33 * 2),
                                   *(undefined1 (*) [16])((long)pvVar20 + lVar33 * 2 + 0x10));
              auVar13 = vmaxps_avx(auVar13,auVar48);
              *(undefined1 (*) [16])((long)pvVar36 + lVar33) = auVar13;
              lVar30 = lVar30 + -0x20;
              lVar33 = lVar33 + 0x10;
            }
            pvVar18 = (void *)((long)pvVar18 - lVar30);
            pvVar20 = (void *)((long)pvVar20 - lVar30);
            pvVar36 = (void *)((long)pvVar36 + lVar33);
          }
          Mat::~Mat(&m);
        }
      }
      else {
LAB_001d9820:
        uVar31 = 0;
        uVar43 = uVar43 & 0xffffffff;
        if (iVar15 < 1) {
          uVar43 = uVar31;
        }
        if ((int)uVar16 < 1) {
          uVar19 = uVar31;
        }
        while( true ) {
          local_1a0 = (int)uVar19;
          iVar15 = (int)uVar31;
          if (iVar15 == local_1a0) break;
          Mat::channel(&m,&bottom_blob_bordered_1,iVar15);
          Mat::channel(&bottom_blob_bordered,top_blob,iVar15);
          pvVar36 = bottom_blob_bordered.data;
          Mat::~Mat(&bottom_blob_bordered);
          for (iVar23 = 0; iVar23 <= iVar27; iVar23 = iVar23 + 1) {
            pp_Var3 = this->_vptr_Pooling_x86_avx;
            for (lVar33 = 0; lVar33 <= lVar30; lVar33 = lVar33 + 1) {
              pauVar38 = (undefined1 (*) [16])
                         ((long)m.data +
                         (long)(*(int *)(&this->field_0xdc + (long)pp_Var3[-3]) * (int)lVar33 * 4) *
                         4 + (long)m.w * (long)iVar23 *
                             (long)*(int *)(&this->field_0xe0 + (long)pp_Var3[-3]) * m.elemsize);
              auVar13 = *pauVar38;
              for (uVar31 = 0; uVar43 != uVar31; uVar31 = uVar31 + 1) {
                auVar13 = vmaxps_avx(auVar13,pauVar38[_space_ofs.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start
                                                      [uVar31]]);
              }
              *(undefined1 (*) [16])((long)pvVar36 + lVar33 * 0x10) = auVar13;
            }
            pvVar36 = (void *)((long)pvVar36 + (long)(iVar25 * 4) * 4);
          }
          Mat::~Mat(&m);
          uVar31 = (ulong)(iVar15 + 1);
        }
      }
    }
    else {
      if (((iVar32 != 3 || *(int *)(&this->field_0xd4 + (long)p_Var17) != 3) ||
          (*(int *)(&this->field_0xdc + (long)p_Var17) != 2)) ||
         (*(int *)(&this->field_0xe0 + (long)p_Var17) != 2)) goto LAB_001d9820;
      iVar15 = top_blob->w;
      iVar23 = top_blob->h;
      iVar22 = 0;
      if (iVar23 < 1) {
        iVar23 = 0;
      }
      iVar39 = bottom_blob_bordered_1.c;
      if (bottom_blob_bordered_1.c < 1) {
        iVar39 = 0;
      }
      lVar30 = (long)((bottom_blob_bordered_1.w - iVar15) * 8) * 4;
      for (; iVar22 != iVar39; iVar22 = iVar22 + 1) {
        Mat::channel(&m,&bottom_blob_bordered_1,iVar22);
        Mat::channel(&bottom_blob_bordered,top_blob,iVar22);
        pauVar38 = (undefined1 (*) [16])bottom_blob_bordered.data;
        Mat::~Mat(&bottom_blob_bordered);
        pvVar36 = (void *)((long)m.data + (long)m.w * m.elemsize);
        pvVar18 = (void *)((long)m.data + (long)m.w * m.elemsize * 2);
        pvVar20 = m.data;
        for (iVar27 = 0; iVar27 != iVar23; iVar27 = iVar27 + 1) {
          lVar33 = 0;
          for (iVar25 = 0; iVar25 + 1 < iVar15; iVar25 = iVar25 + 2) {
            auVar13 = *(undefined1 (*) [16])((long)pvVar36 + lVar33 + 0x20);
            auVar48 = *(undefined1 (*) [16])((long)pvVar18 + lVar33 + 0x20);
            auVar47 = *(undefined1 (*) [16])((long)pvVar20 + lVar33 + 0x20);
            auVar4 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar20 + lVar33),
                                *(undefined1 (*) [16])((long)pvVar20 + lVar33 + 0x10));
            auVar4 = vmaxps_avx(auVar4,auVar47);
            auVar4 = vmaxps_avx(auVar4,*(undefined1 (*) [16])((long)pvVar36 + lVar33));
            auVar4 = vmaxps_avx(auVar4,*(undefined1 (*) [16])((long)pvVar36 + lVar33 + 0x10));
            auVar5 = vmaxps_avx(auVar13,*(undefined1 (*) [16])((long)pvVar18 + lVar33));
            auVar5 = vmaxps_avx(auVar5,*(undefined1 (*) [16])((long)pvVar18 + lVar33 + 0x10));
            auVar5 = vmaxps_avx(auVar5,auVar48);
            auVar6 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar20 + lVar33 + 0x30),
                                *(undefined1 (*) [16])((long)pvVar20 + lVar33 + 0x40));
            auVar47 = vmaxps_avx(auVar6,auVar47);
            auVar47 = vmaxps_avx(auVar47,*(undefined1 (*) [16])((long)pvVar36 + lVar33 + 0x30));
            auVar47 = vmaxps_avx(auVar47,*(undefined1 (*) [16])((long)pvVar36 + lVar33 + 0x40));
            auVar13 = vmaxps_avx(auVar13,*(undefined1 (*) [16])((long)pvVar18 + lVar33 + 0x30));
            auVar47 = vmaxps_avx(auVar47,*(undefined1 (*) [16])((long)pvVar18 + lVar33 + 0x40));
            auVar4 = vmaxps_avx(auVar4,auVar5);
            *pauVar38 = auVar4;
            auVar13 = vmaxps_avx(auVar48,auVar13);
            auVar13 = vmaxps_avx(auVar47,auVar13);
            pauVar38[1] = auVar13;
            pauVar38 = pauVar38 + 2;
            lVar33 = lVar33 + 0x40;
          }
          for (; iVar25 < iVar15; iVar25 = iVar25 + 1) {
            auVar13 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar20 + lVar33),
                                 *(undefined1 (*) [16])((long)pvVar20 + lVar33 + 0x10));
            auVar13 = vmaxps_avx(auVar13,*(undefined1 (*) [16])((long)pvVar20 + lVar33 + 0x20));
            auVar13 = vmaxps_avx(auVar13,*(undefined1 (*) [16])((long)pvVar36 + lVar33));
            auVar13 = vmaxps_avx(auVar13,*(undefined1 (*) [16])((long)pvVar36 + lVar33 + 0x10));
            auVar48 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar36 + lVar33 + 0x20),
                                 *(undefined1 (*) [16])((long)pvVar18 + lVar33));
            auVar48 = vmaxps_avx(auVar48,*(undefined1 (*) [16])((long)pvVar18 + lVar33 + 0x10));
            auVar48 = vmaxps_avx(auVar48,*(undefined1 (*) [16])((long)pvVar18 + lVar33 + 0x20));
            auVar13 = vmaxps_avx(auVar13,auVar48);
            *pauVar38 = auVar13;
            pauVar38 = pauVar38 + 1;
            lVar33 = lVar33 + 0x20;
          }
          pvVar20 = (void *)((long)pvVar20 + lVar33 + lVar30);
          pvVar36 = (void *)((long)pvVar36 + lVar33 + lVar30);
          pvVar18 = (void *)((long)pvVar18 + lVar33 + lVar30);
        }
        Mat::~Mat(&m);
      }
    }
  }
  else if (*(int *)(&this->field_0xd0 + (long)p_Var17) == 1) {
    if (*(int *)(&this->field_0xfc + (long)p_Var17) == 0) {
      iVar15 = 0;
      iVar39 = 0;
      if (*(int *)(&this->field_0xf8 + (long)p_Var17) == 0) {
        iVar15 = (bottom_blob->w - bottom_blob_bordered_1.w) +
                 *(int *)(&this->field_0xe4 + (long)p_Var17) +
                 *(int *)(&this->field_0xe8 + (long)p_Var17);
        iVar39 = (bottom_blob->h - bottom_blob_bordered_1.h) +
                 *(int *)(&this->field_0xec + (long)p_Var17) +
                 *(int *)(&this->field_0xf0 + (long)p_Var17);
      }
      if ((int)uVar16 < 1) {
        uVar16 = 0;
      }
      for (uVar41 = 0; uVar41 != uVar16; uVar41 = uVar41 + 1) {
        Mat::channel(&m,&bottom_blob_bordered_1,uVar41);
        Mat::channel(&bottom_blob_bordered,top_blob,uVar41);
        local_190 = bottom_blob_bordered.data;
        Mat::~Mat(&bottom_blob_bordered);
        pp_Var3 = this->_vptr_Pooling_x86_avx;
        for (iVar26 = 0; iVar26 <= iVar27; iVar26 = iVar26 + 1) {
          lVar33 = (long)(*(int *)(&this->field_0xe0 + (long)pp_Var3[-3]) * iVar26);
          for (lVar28 = 0; lVar28 <= lVar30; lVar28 = lVar28 + 1) {
            p_Var17 = pp_Var3[-3];
            uVar43 = 0;
            uVar19 = (ulong)*(uint *)(&this->field_0xd8 + (long)p_Var17);
            if ((int)*(uint *)(&this->field_0xd8 + (long)p_Var17) < 1) {
              uVar19 = uVar43;
            }
            lVar24 = (long)(*(int *)(&this->field_0xdc + (long)p_Var17) * (int)lVar28);
            lVar34 = lVar24 * 0x10 + (long)m.w * m.elemsize * lVar33 + (long)m.data;
            fVar53 = 0.0;
            fVar54 = 0.0;
            fVar46 = 0.0;
            fVar52 = 0.0;
            iVar29 = 0;
            for (; uVar43 != uVar19; uVar43 = uVar43 + 1) {
              lVar21 = uVar43 + lVar33;
              if (*(int *)(&this->field_0xec + (long)p_Var17) <= lVar21) {
                if ((iVar39 + iVar22) - *(int *)(&this->field_0xf0 + (long)p_Var17) <= lVar21)
                break;
                uVar14 = *(uint *)(&this->field_0xd4 + (long)p_Var17);
                if ((int)*(uint *)(&this->field_0xd4 + (long)p_Var17) < 1) {
                  uVar14 = 0;
                }
                lVar21 = lVar24;
                for (lVar42 = 0; (ulong)uVar14 * 0x10 != lVar42; lVar42 = lVar42 + 0x10) {
                  if (*(int *)(&this->field_0xe4 + (long)p_Var17) <= lVar21) {
                    if ((iVar15 + iVar23) - *(int *)(&this->field_0xe8 + (long)p_Var17) <= lVar21)
                    break;
                    pfVar40 = (float *)(lVar34 + lVar42);
                    fVar46 = fVar46 + *pfVar40;
                    fVar52 = fVar52 + pfVar40[1];
                    fVar53 = fVar53 + pfVar40[2];
                    fVar54 = fVar54 + pfVar40[3];
                    iVar29 = iVar29 + 1;
                  }
                  lVar21 = lVar21 + 1;
                }
              }
              lVar34 = lVar34 + (long)m.w * m.elemsize;
            }
            auVar13 = vshufps_avx(ZEXT416((uint)(1.0 / (float)iVar29)),
                                  ZEXT416((uint)(1.0 / (float)iVar29)),0);
            auVar48._0_4_ = auVar13._0_4_ * fVar46;
            auVar48._4_4_ = auVar13._4_4_ * fVar52;
            auVar48._8_4_ = auVar13._8_4_ * fVar53;
            auVar48._12_4_ = auVar13._12_4_ * fVar54;
            *(undefined1 (*) [16])((long)local_190 + lVar28 * 0x10) = auVar48;
          }
          local_190 = (void *)((long)local_190 + (long)(iVar25 * 4) * 4);
        }
        Mat::~Mat(&m);
      }
    }
    else {
      uVar31 = 0;
      uVar43 = uVar43 & 0xffffffff;
      if (iVar15 < 1) {
        uVar43 = uVar31;
      }
      auVar13 = vshufps_avx(ZEXT416((uint)(1.0 / (float)iVar15)),
                            ZEXT416((uint)(1.0 / (float)iVar15)),0);
      if ((int)uVar16 < 1) {
        uVar19 = uVar31;
      }
      while( true ) {
        local_1a0 = (int)uVar19;
        iVar15 = (int)uVar31;
        if (iVar15 == local_1a0) break;
        Mat::channel(&m,&bottom_blob_bordered_1,iVar15);
        Mat::channel(&bottom_blob_bordered,top_blob,iVar15);
        pvVar36 = bottom_blob_bordered.data;
        Mat::~Mat(&bottom_blob_bordered);
        for (iVar23 = 0; iVar23 <= iVar27; iVar23 = iVar23 + 1) {
          pp_Var3 = this->_vptr_Pooling_x86_avx;
          for (lVar33 = 0; lVar33 <= lVar30; lVar33 = lVar33 + 1) {
            fVar53 = 0.0;
            fVar54 = 0.0;
            fVar46 = 0.0;
            fVar52 = 0.0;
            for (uVar31 = 0; uVar43 != uVar31; uVar31 = uVar31 + 1) {
              pfVar40 = (float *)((long)m.data +
                                 (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start[uVar31] * 0x10 +
                                 (long)(*(int *)(&this->field_0xdc + (long)pp_Var3[-3]) *
                                        (int)lVar33 * 4) * 4 +
                                 (long)m.w * (long)iVar23 *
                                 (long)*(int *)(&this->field_0xe0 + (long)pp_Var3[-3]) * m.elemsize)
              ;
              fVar53 = fVar53 + *pfVar40;
              fVar54 = fVar54 + pfVar40[1];
              fVar46 = fVar46 + pfVar40[2];
              fVar52 = fVar52 + pfVar40[3];
            }
            local_108 = auVar13._0_4_;
            fStack_104 = auVar13._4_4_;
            fStack_100 = auVar13._8_4_;
            fStack_fc = auVar13._12_4_;
            auVar47._0_4_ = fVar53 * local_108;
            auVar47._4_4_ = fVar54 * fStack_104;
            auVar47._8_4_ = fVar46 * fStack_100;
            auVar47._12_4_ = fVar52 * fStack_fc;
            *(undefined1 (*) [16])((long)pvVar36 + lVar33 * 0x10) = auVar47;
          }
          pvVar36 = (void *)((long)pvVar36 + (long)(iVar25 * 4) * 4);
        }
        Mat::~Mat(&m);
        uVar31 = (ulong)(iVar15 + 1);
      }
    }
  }
LAB_001d9e12:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
  iVar15 = 0;
LAB_001d9e25:
  Mat::~Mat(&bottom_blob_bordered_1);
  return iVar15;
}

Assistant:

int Pooling_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    if (adaptive_pooling)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

#if __SSE2__
    int elempack = bottom_blob.elempack;
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
#if __AVX__

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (elempack == 8)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m256 _max = _mm256_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m256 _val = _mm256_loadu_ps(ptr);
                        _max = _mm256_max_ps(_max, _val);
                        ptr += 8;
                    }

                    float* outptr = top_blob;
                    _mm256_storeu_ps(outptr + q * 8, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m256 _sum = _mm256_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m256 _val = _mm256_loadu_ps(ptr);
                        _sum = _mm256_add_ps(_sum, _val);
                        ptr += 8;
                    }

                    __m256 _inv_size = _mm256_set1_ps(1.f / size);
                    __m256 _avg = _mm256_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm256_storeu_ps(outptr + q * 8, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack8_avx(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack8_avx(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                        __m256 _max = _mm256_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                            _max = _mm256_max_ps(_max, _val);
                        }

                        _mm256_storeu_ps(outptr + j * 8, _max);
                    }

                    outptr += outw * 8;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m256 _sum = _mm256_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m256 _val = _mm256_loadu_ps(m.row(sy) + sx * 8);
                                    _sum = _mm256_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m256 _inv_area = _mm256_set1_ps(1.f / area);
                            __m256 _avg = _mm256_mul_ps(_sum, _inv_area);
                            _mm256_storeu_ps(outptr + j * 8, _avg);
                        }

                        outptr += outw * 8;
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m256 _inv_maxk = _mm256_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            __m256 _sum = _mm256_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                _sum = _mm256_add_ps(_sum, _val);
                            }

                            __m256 _avg = _mm256_mul_ps(_sum, _inv_maxk);
                            _mm256_storeu_ps(outptr + j * 8, _avg);
                        }

                        outptr += outw * 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m128 _max = _mm_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m128 _val = _mm_loadu_ps(ptr);
                        _max = _mm_max_ps(_max, _val);
                        ptr += 4;
                    }

                    float* outptr = top_blob;
                    _mm_storeu_ps(outptr + q * 4, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m128 _sum = _mm_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m128 _val = _mm_loadu_ps(ptr);
                        _sum = _mm_add_ps(_sum, _val);
                        ptr += 4;
                    }

                    __m128 _inv_size = _mm_set1_ps(1.f / size);
                    __m128 _avg = _mm_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm_storeu_ps(outptr + q * 4, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack4_sse(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack4_sse(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                        __m128 _max = _mm_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                            _max = _mm_max_ps(_max, _val);
                        }

                        _mm_storeu_ps(outptr + j * 4, _max);
                    }

                    outptr += outw * 4;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m128 _sum = _mm_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m128 _val = _mm_loadu_ps(m.row(sy) + sx * 4);
                                    _sum = _mm_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m128 _inv_area = _mm_set1_ps(1.f / area);
                            __m128 _avg = _mm_mul_ps(_sum, _inv_area);
                            _mm_storeu_ps(outptr + j * 4, _avg);
                        }

                        outptr += outw * 4;
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m128 _inv_maxk = _mm_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            __m128 _sum = _mm_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                _sum = _mm_add_ps(_sum, _val);
                            }

                            __m128 _avg = _mm_mul_ps(_sum, _inv_maxk);
                            _mm_storeu_ps(outptr + j * 4, _avg);
                        }

                        outptr += outw * 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (kernel_w != kernel_h || stride_w != stride_h)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

    const int stride = stride_w;

    if (pooling_type != PoolMethod_MAX || stride != 2 || global_pooling == 1)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

#if __AVX__
    const int kernel_size = kernel_w;

    if (kernel_size != 2)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (kernel_size == 2)
        pooling2x2s2_max_avx(bottom_blob_bordered, top_blob, opt);

    return 0;
#else
    return Pooling::forward(bottom_blob, top_blob, opt);
#endif
}